

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
sentencepiece::unigram::Lattice::BackwardAlgorithm(Lattice *this,float inv_theta)

{
  bool bVar1;
  reference ppNVar2;
  reference pvVar3;
  const_reference this_00;
  long in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  float fVar4;
  Node *rnode;
  const_iterator __end4;
  const_iterator __begin4;
  value_type *__range4;
  Node *lnode;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  int pos;
  int len;
  vector<float,_std::allocator<float>_> *beta;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined1 init_mode;
  undefined4 in_stack_ffffffffffffff4c;
  float x;
  value_type_conflict5 *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  vector<float,_std::allocator<float>_> *this_01;
  __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
  local_68;
  const_reference local_60;
  Node *local_58;
  Node **local_50;
  __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
  local_48;
  const_reference local_40;
  int local_38;
  undefined4 local_20;
  undefined1 local_19;
  int local_18;
  Node *pNVar5;
  
  this_01 = in_RDI;
  local_18 = size((Lattice *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  local_19 = 0;
  model::FreeList<sentencepiece::unigram::Lattice::Node>::size
            ((FreeList<sentencepiece::unigram::Lattice::Node> *)(in_RSI + 0x60));
  local_20 = 0;
  std::allocator<float>::allocator((allocator<float> *)0x47ed6e);
  std::vector<float,_std::allocator<float>_>::vector
            (this_01,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::allocator<float>::~allocator((allocator<float> *)0x47ed99);
  for (local_38 = local_18; -1 < local_38; local_38 = local_38 + -1) {
    local_40 = std::
               vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
               ::operator[]((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                             *)(in_RSI + 0x48),(long)local_38);
    local_48._M_current =
         (Node **)std::
                  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                  ::begin(in_stack_ffffffffffffff38);
    local_50 = (Node **)std::
                        vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                        ::end(in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              (__normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      ppNVar2 = __gnu_cxx::
                __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                ::operator*(&local_48);
      local_58 = *ppNVar2;
      local_60 = std::
                 vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                 ::operator[]((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                               *)(in_RSI + 0x30),(long)local_38);
      local_68._M_current =
           (Node **)std::
                    vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                    ::begin(in_stack_ffffffffffffff38);
      std::
      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::end(in_stack_ffffffffffffff38);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                (__normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                                 *)in_stack_ffffffffffffff38), bVar1) {
        ppNVar2 = __gnu_cxx::
                  __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                  ::operator*(&local_68);
        pNVar5 = *ppNVar2;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (in_RDI,(ulong)local_58->node_id);
        init_mode = (undefined1)((uint)*pvVar3 >> 0x18);
        in_stack_ffffffffffffff44 = pNVar5->score;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (in_RDI,(ulong)pNVar5->node_id);
        fVar4 = in_stack_ffffffffffffff44 + *pvVar3;
        this_00 = std::
                  vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                  ::operator[]((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                                *)(in_RSI + 0x30),(long)local_38);
        x = SUB84(pNVar5,0);
        std::
        vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ::operator[](this_00,0);
        fVar4 = anon_unknown_0::LogSumExp(x,fVar4,(bool)init_mode);
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (in_RDI,(ulong)local_58->node_id);
        *pvVar3 = fVar4;
        __gnu_cxx::
        __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
        ::operator++(&local_68);
      }
      __gnu_cxx::
      __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
      ::operator++(&local_48);
    }
  }
  return this_01;
}

Assistant:

std::vector<float> Lattice::BackwardAlgorithm(float inv_theta) const {
  const int len = size();
  std::vector<float> beta(node_allocator_.size(), 0.0);

  for (int pos = len; pos >= 0; --pos) {
    for (Node *lnode : end_nodes_[pos]) {
      for (Node *rnode : begin_nodes_[pos]) {
        beta[lnode->node_id] =
            LogSumExp(beta[lnode->node_id], rnode->score + beta[rnode->node_id],
                      rnode == begin_nodes_[pos][0]);
      }
    }
  }

  return beta;
}